

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_sign_with_k(uint8_t *private_key,uint8_t *message_hash,uint hash_size,uECC_word_t *k,
                    uint8_t *signature,uECC_Curve curve)

{
  wordcount_t num_words_00;
  short sVar1;
  wordcount_t num_words_01;
  cmpresult_t cVar2;
  bitcount_t bVar3;
  int iVar4;
  uECC_word_t uVar5;
  bitcount_t num_n_bits;
  wordcount_t num_n_words;
  wordcount_t num_words;
  uECC_word_t carry;
  uECC_word_t p [8];
  uECC_word_t *k2 [2];
  uECC_word_t s [4];
  uECC_word_t tmp [4];
  uECC_Curve curve_local;
  uint8_t *signature_local;
  uECC_word_t *k_local;
  uint hash_size_local;
  uint8_t *message_hash_local;
  uint8_t *private_key_local;
  
  p[7] = (uECC_word_t)(s + 3);
  k2[0] = (uECC_word_t *)(k2 + 1);
  num_words_00 = curve->num_words;
  num_words_01 = (wordcount_t)((curve->num_n_bits + 0x3f) / 0x40);
  sVar1 = curve->num_n_bits;
  uVar5 = uECC_vli_isZero(k,num_words_00);
  if ((uVar5 == 0) && (cVar2 = uECC_vli_cmp(curve->n,k,num_words_01), cVar2 == '\x01')) {
    uVar5 = regularize_k(k,s + 3,(uECC_word_t *)(k2 + 1),curve);
    EccPoint_mult(&carry,curve->G,(uECC_word_t *)p[(long)(int)(uint)((uVar5 != 0 ^ 0xffU) & 1) + 7],
                  (uECC_word_t *)0x0,sVar1 + 1,curve);
    uVar5 = uECC_vli_isZero(&carry,num_words_00);
    if (uVar5 == 0) {
      if (g_rng_function == (uECC_RNG_Function)0x0) {
        uECC_vli_clear(s + 3,num_words_01);
        s[3] = 1;
      }
      else {
        iVar4 = uECC_generate_random_int(s + 3,curve->n,num_words_01);
        if (iVar4 == 0) {
          return 0;
        }
      }
      uECC_vli_modMult(k,k,s + 3,curve->n,num_words_01);
      uECC_vli_modInv(k,k,curve->n,num_words_01);
      uECC_vli_modMult(k,k,s + 3,curve->n,num_words_01);
      uECC_vli_nativeToBytes(signature,(int)curve->num_bytes,&carry);
      uECC_vli_bytesToNative(s + 3,private_key,(curve->num_n_bits + 7) / 8);
      k2[(long)(num_words_01 + -1) + 1] = (uECC_word_t *)0x0;
      uECC_vli_set((uECC_word_t *)(k2 + 1),&carry,num_words_00);
      uECC_vli_modMult((uECC_word_t *)(k2 + 1),s + 3,(uECC_word_t *)(k2 + 1),curve->n,num_words_01);
      bits2int(s + 3,message_hash,hash_size,curve);
      uECC_vli_modAdd((uECC_word_t *)(k2 + 1),s + 3,(uECC_word_t *)(k2 + 1),curve->n,num_words_01);
      uECC_vli_modMult((uECC_word_t *)(k2 + 1),(uECC_word_t *)(k2 + 1),k,curve->n,num_words_01);
      bVar3 = uECC_vli_numBits((uECC_word_t *)(k2 + 1),num_words_01);
      if ((short)curve->num_bytes * 8 < (int)bVar3) {
        private_key_local._4_4_ = 0;
      }
      else {
        uECC_vli_nativeToBytes
                  (signature + (int)curve->num_bytes,(int)curve->num_bytes,(uECC_word_t *)(k2 + 1));
        private_key_local._4_4_ = 1;
      }
    }
    else {
      private_key_local._4_4_ = 0;
    }
  }
  else {
    private_key_local._4_4_ = 0;
  }
  return private_key_local._4_4_;
}

Assistant:

static int uECC_sign_with_k(const uint8_t *private_key,
                            const uint8_t *message_hash,
                            unsigned hash_size,
                            uECC_word_t *k,
                            uint8_t *signature,
                            uECC_Curve curve) {

    uECC_word_t tmp[uECC_MAX_WORDS];
    uECC_word_t s[uECC_MAX_WORDS];
    uECC_word_t *k2[2] = {tmp, s};
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *p = (uECC_word_t *)signature;
#else
    uECC_word_t p[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t carry;
    wordcount_t num_words = curve->num_words;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;

    /* Make sure 0 < k < curve_n */
    if (uECC_vli_isZero(k, num_words) || uECC_vli_cmp(curve->n, k, num_n_words) != 1) {
        return 0;
    }

    carry = regularize_k(k, tmp, s, curve);
    EccPoint_mult(p, curve->G, k2[!carry], 0, num_n_bits + 1, curve);
    if (uECC_vli_isZero(p, num_words)) {
        return 0;
    }

    /* If an RNG function was specified, get a random number
       to prevent side channel analysis of k. */
    if (!g_rng_function) {
        uECC_vli_clear(tmp, num_n_words);
        tmp[0] = 1;
    } else if (!uECC_generate_random_int(tmp, curve->n, num_n_words)) {
        return 0;
    }

    /* Prevent side channel analysis of uECC_vli_modInv() to determine
       bits of k / the private key by premultiplying by a random number */
    uECC_vli_modMult(k, k, tmp, curve->n, num_n_words); /* k' = rand * k */
    uECC_vli_modInv(k, k, curve->n, num_n_words);       /* k = 1 / k' */
    uECC_vli_modMult(k, k, tmp, curve->n, num_n_words); /* k = 1 / k */

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(signature, curve->num_bytes, p); /* store r */
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) tmp, private_key, BITS_TO_BYTES(curve->num_n_bits));
#else
    uECC_vli_bytesToNative(tmp, private_key, BITS_TO_BYTES(curve->num_n_bits)); /* tmp = d */
#endif

    s[num_n_words - 1] = 0;
    uECC_vli_set(s, p, num_words);
    uECC_vli_modMult(s, tmp, s, curve->n, num_n_words); /* s = r*d */

    bits2int(tmp, message_hash, hash_size, curve);
    uECC_vli_modAdd(s, tmp, s, curve->n, num_n_words); /* s = e + r*d */
    uECC_vli_modMult(s, s, k, curve->n, num_n_words);  /* s = (e + r*d) / k */
    if (uECC_vli_numBits(s, num_n_words) > (bitcount_t)curve->num_bytes * 8) {
        return 0;
    }
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) signature + curve->num_bytes, (uint8_t *) s, curve->num_bytes);
#else
    uECC_vli_nativeToBytes(signature + curve->num_bytes, curve->num_bytes, s);
#endif    
    return 1;
}